

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<InterfaceVariableRename,_8UL>::push_back
          (SmallVector<InterfaceVariableRename,_8UL> *this,InterfaceVariableRename *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  InterfaceVariableRename *pIVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  InterfaceVariableRename *pIVar5;
  size_t sVar6;
  pointer pcVar7;
  size_type sVar8;
  uint32_t uVar9;
  
  reserve(this,(this->super_VectorView<InterfaceVariableRename>).buffer_size + 1);
  pIVar5 = (this->super_VectorView<InterfaceVariableRename>).ptr;
  sVar6 = (this->super_VectorView<InterfaceVariableRename>).buffer_size;
  pIVar3 = pIVar5 + sVar6;
  uVar9 = t->location;
  pIVar3->storageClass = t->storageClass;
  pIVar3->location = uVar9;
  paVar4 = &pIVar5[sVar6].variable_name.field_2;
  (&paVar4->_M_allocated_capacity)[-2] = (size_type)paVar4;
  pcVar7 = (t->variable_name)._M_dataplus._M_p;
  paVar1 = &(t->variable_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar1) {
    sVar8 = *(size_type *)((long)&(t->variable_name).field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    (&paVar4->_M_allocated_capacity)[1] = sVar8;
  }
  else {
    (pIVar3->variable_name)._M_dataplus._M_p = pcVar7;
    (pIVar3->variable_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pIVar3->variable_name)._M_string_length = (t->variable_name)._M_string_length;
  (t->variable_name)._M_dataplus._M_p = (pointer)paVar1;
  (t->variable_name)._M_string_length = 0;
  (t->variable_name).field_2._M_local_buf[0] = '\0';
  psVar2 = &(this->super_VectorView<InterfaceVariableRename>).buffer_size;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}